

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Key.hpp
# Opt level: O2

Key<1UL> supermap::Key<1UL>::fromString(string *strKey)

{
  IllegalArgumentException *this;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (strKey->_M_string_length == 1) {
    return (array<unsigned_char,_1UL>)
           (array<unsigned_char,_1UL>)(*(_Type *)(strKey->_M_dataplus)._M_p)[0];
  }
  this = (IllegalArgumentException *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&sStack_58,1);
  std::operator+(&local_38,
                 "String key length can not be different to template size parameter, expected: ",
                 &sStack_58);
  supermap::IllegalArgumentException::IllegalArgumentException(this,(string *)&local_38);
  __cxa_throw(this,&IllegalArgumentException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static Key<Len> fromString(const std::string &strKey) {
        if (strKey.length() != Len) {
            throw IllegalArgumentException(
                "String key length can not be different to template size parameter, expected: " + std::to_string(Len));
        }

        Key<Len> arrKey;
        for (std::size_t i = 0; i < strKey.length(); ++i) {
            arrKey[i] = strKey[i];
        }

        return arrKey;
    }